

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase284::run(TestCase284 *this)

{
  bool bVar1;
  Type local_300;
  bool local_2f9;
  Type local_2f8;
  DebugExpression<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1)>
  DStack_2f4;
  bool _kj_shouldLog_1;
  undefined1 local_2f0 [8];
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  _kjCondition_1;
  int local_2c0;
  DebugExpression<int> DStack_2bc;
  bool _kj_shouldLog;
  undefined1 local_2b8 [8];
  DebugComparison<int,_int_&> _kjCondition;
  SourceLocation local_288;
  undefined1 local_270 [16];
  siginfo_t info;
  Function<void_()> local_1e0;
  undefined1 local_1d0 [8];
  Thread thread;
  pthread_t mainThread;
  WaitScope waitScope;
  undefined1 local_180 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase284 *this_local;
  
  if (((anonymous_namespace)::BROKEN_QEMU & 1) == 0) {
    captureSignals();
    UnixEventPort::UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
    EventLoop::EventLoop((EventLoop *)local_180,(EventPort *)&loop.currentlyFiring);
    WaitScope::WaitScope((WaitScope *)&mainThread,(EventLoop *)local_180);
    thread._16_8_ = pthread_self();
    info._sifields._104_8_ = &thread.detached;
    Function<void()>::Function<kj::(anonymous_namespace)::TestCase284::run()::__0>
              ((Function<void()> *)&local_1e0,(Type *)((long)&info._sifields + 0x68));
    Thread::Thread((Thread *)local_1d0,&local_1e0);
    Function<void_()>::~Function(&local_1e0);
    UnixEventPort::onSignal((UnixEventPort *)local_270,(int)&loop + 0x70);
    SourceLocation::SourceLocation
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,"run",0x131,0x14);
    Promise<siginfo_t>::wait((Promise<siginfo_t> *)(local_270 + 8),local_270);
    Promise<siginfo_t>::~Promise((Promise<siginfo_t> *)local_270);
    local_2c0 = 0x17;
    DStack_2bc = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2c0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int_&> *)local_2b8,&stack0xfffffffffffffd44,
               (int *)(local_270 + 8));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
    if (!bVar1) {
      _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_1._39_1_ != '\0') {
        _kjCondition_1.result = true;
        _kjCondition_1._33_3_ = 0;
        kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,int&>&,int,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x132,ERROR,
                   "\"failed: expected \" \"(23) == (info.si_signo)\", _kjCondition, 23, info.si_signo"
                   ,(char (*) [41])"failed: expected (23) == (info.si_signo)",
                   (DebugComparison<int,_int_&> *)local_2b8,(int *)&_kjCondition_1.result,
                   (int *)(local_270 + 8));
        _kjCondition_1._39_1_ = 0;
      }
    }
    local_2f8 = SI_TKILL;
    DStack_2f4 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2f8);
    kj::_::DebugExpression<$_11>::operator==
              ((DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                *)local_2f0,(DebugExpression<__11> *)&stack0xfffffffffffffd0c,&info.si_signo);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f0);
    if (!bVar1) {
      local_2f9 = kj::_::Debug::shouldLog(ERROR);
      while (local_2f9 != false) {
        local_300 = SI_TKILL;
        kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x134,ERROR,
                   "\"failed: expected \" \"(SI_TKILL) == (info.si_code)\", _kjCondition, SI_TKILL, info.si_code"
                   ,(char (*) [46])"failed: expected (SI_TKILL) == (info.si_code)",
                   (DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
                    *)local_2f0,&local_300,&info.si_signo);
        local_2f9 = false;
      }
    }
    Thread::~Thread((Thread *)local_1d0);
    WaitScope::~WaitScope((WaitScope *)&mainThread);
    EventLoop::~EventLoop((EventLoop *)local_180);
    UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.currentlyFiring);
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  if (BROKEN_QEMU) return;

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread KJ_UNUSED = pthread_self();
  Thread thread([&]() {
    delay();
#if __APPLE__ && KJ_USE_KQUEUE
    // MacOS kqueue only receives process-level signals and there's nothing much we can do about
    // that.
    kill(getpid(), SIGURG);
#else
    pthread_kill(mainThread, SIGURG);
#endif
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}